

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O0

bool draco::anon_unknown_13::DecodeVarintUnsigned<unsigned_int>
               (int depth,uint *out_val,DecoderBuffer *buffer)

{
  bool bVar1;
  DecoderBuffer *in_RDX;
  uint *in_RSI;
  uint in_EDI;
  uint8_t in;
  uint max_depth;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  bool local_1;
  
  uVar2 = 5;
  if (in_EDI < 6) {
    bVar1 = DecoderBuffer::Decode<unsigned_char>
                      (in_RDX,(uchar *)CONCAT44(5,in_stack_ffffffffffffffe0));
    if (bVar1) {
      if ((in_stack_ffffffffffffffe0 & 0x80000000) == 0) {
        *in_RSI = in_stack_ffffffffffffffe0 >> 0x18;
      }
      else {
        bVar1 = DecodeVarintUnsigned<unsigned_int>
                          ((int)in_RSI,(uint *)in_RDX,
                           (DecoderBuffer *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
        if (!bVar1) {
          return false;
        }
        *in_RSI = *in_RSI << 7;
        *in_RSI = in_stack_ffffffffffffffe0 >> 0x18 & 0x7f | *in_RSI;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DecodeVarintUnsigned(int depth, IntTypeT *out_val, DecoderBuffer *buffer) {
  constexpr IntTypeT max_depth = sizeof(IntTypeT) + 1 + (sizeof(IntTypeT) >> 3);
  if (depth > max_depth) {
    return false;
  }
  // Coding of unsigned values.
  // 0-6 bit - data
  // 7 bit - next byte?
  uint8_t in;
  if (!buffer->Decode(&in)) {
    return false;
  }
  if (in & (1 << 7)) {
    // Next byte is available, decode it first.
    if (!DecodeVarintUnsigned<IntTypeT>(depth + 1, out_val, buffer)) {
      return false;
    }
    // Append decoded info from this byte.
    *out_val <<= 7;
    *out_val |= in & ((1 << 7) - 1);
  } else {
    // Last byte reached
    *out_val = in;
  }
  return true;
}